

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall
helics::CommsInterface::addRoute(CommsInterface *this,route_id rid,string_view routeInfo)

{
  BaseType data;
  ActionMessage *in_RDI;
  ActionMessage route;
  undefined4 in_stack_ffffffffffffff1c;
  route_id in_stack_ffffffffffffff24;
  action_t in_stack_ffffffffffffff2c;
  ActionMessage *in_stack_ffffffffffffff30;
  SmallBuffer *in_stack_ffffffffffffff38;
  route_id local_4;
  
  ActionMessage::ActionMessage(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  SmallBuffer::operator=
            (in_stack_ffffffffffffff38,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff30);
  data = route_id::baseValue(&local_4);
  ActionMessage::setExtraData(in_RDI,data);
  transmit((CommsInterface *)CONCAT44(in_stack_ffffffffffffff1c,0xffffffff),
           in_stack_ffffffffffffff24,in_RDI);
  ActionMessage::~ActionMessage(in_RDI);
  return;
}

Assistant:

void CommsInterface::addRoute(route_id rid, std::string_view routeInfo)
{
    ActionMessage route(CMD_PROTOCOL_PRIORITY);
    route.payload = routeInfo;
    route.messageID = NEW_ROUTE;
    route.setExtraData(rid.baseValue());
    transmit(control_route, std::move(route));
}